

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic-base.hxx
# Opt level: O2

Solution * __thiscall
lineage::heuristics::
applyInitializedHeuristic<lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
          (Solution *__return_storage_ptr__,heuristics *this,ProblemGraph *problemGraph,
          double costTermination,double costBirth,bool enforceBifurcationConstraint,
          string *solutionName,size_t maxDistance)

{
  vector<double,_std::allocator<double>_> *this_00;
  undefined8 *puVar1;
  undefined7 in_register_00000009;
  undefined8 *puVar2;
  double costBirth_local;
  double costTermination_local;
  Solution init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2c0;
  Data data;
  LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
  search;
  
  costBirth_local = costBirth;
  costTermination_local = costTermination;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(in_register_00000009,enforceBifurcationConstraint),"-optimization-log.txt"
                );
  std::ofstream::ofstream(&search,(string *)&data,_S_out);
  std::__cxx11::string::~string((string *)&data);
  std::operator<<((ostream *)&search,
                  "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
                 );
  std::ofstream::close();
  std::ofstream::~ofstream(&search);
  data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.solutionName._M_dataplus._M_p = (pointer)&data.solutionName.field_2;
  data.solutionName._M_string_length = 0;
  data.solutionName.field_2._M_local_buf[0] = '\0';
  data.timer.m_seconds = 0.0;
  data.timer.m_timeObject.__d.__r = (duration)0;
  data.costBirth = costBirth_local;
  data.costTermination = costTermination_local;
  data.problemGraph = (ProblemGraph *)this;
  data.enforceBifurcationConstraint = (bool)(char)problemGraph;
  std::__cxx11::string::_M_assign((string *)&data.solutionName);
  this_00 = &data.costs;
  puVar1 = *(undefined8 **)(*(long *)this + 0x20);
  data.maxDistance = (size_t)solutionName;
  for (puVar2 = *(undefined8 **)(*(long *)this + 0x18); puVar2 != puVar1; puVar2 = puVar2 + 3) {
    search.
    super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
    .super_HeuristicBase._16_8_ = puVar2[2];
    search.
    super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
    .super_HeuristicBase._vptr_HeuristicBase = (_func_int **)*puVar2;
    search.
    super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
    .super_HeuristicBase.data_ = (Data *)puVar2[1];
    std::vector<double,_std::allocator<double>_>::push_back
              (this_00,(value_type_conflict2 *)
                       &search.
                        super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
                        .super_HeuristicBase.silent_);
  }
  if (0.0 < costTermination_local) {
    std::vector<double,_std::allocator<double>_>::insert
              (this_00,(const_iterator)
                       data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 5,&costTermination_local);
  }
  if (0.0 < costBirth_local) {
    std::vector<double,_std::allocator<double>_>::insert
              (this_00,(const_iterator)
                       data.costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 5,&costBirth_local);
  }
  init.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  init.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  init.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.timer.m_timeObject.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  GreedyLineageAgglomeration
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)&search,
             &data);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::optimize
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)&search);
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::getSolution
            ((Solution *)&local_2e0,
             (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)
             &search.
              super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
              .super_HeuristicBase.data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&init.edge_labels,&local_2e0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2e0);
  levinkov::Timer::stop(&data.timer);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  ~GreedyLineageAgglomeration
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)&search);
  std::operator+(&local_2e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(in_register_00000009,enforceBifurcationConstraint),"-optimization-log.txt"
                );
  std::ofstream::ofstream(&search,(string *)&local_2e0,_S_out);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::operator<<((ostream *)&search,
                  "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
                 );
  std::ofstream::close();
  std::ofstream::~ofstream(&search);
  data.timer.m_timeObject.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2c0,&init.edge_labels);
  LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,_lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::PartitionOptimizerBase(&search,&data,(Solution *)&local_2c0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2c0);
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::optimize(&search.
              super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
            );
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::getSolution(__return_storage_ptr__,
                &search.
                 super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
               );
  levinkov::Timer::stop(&data.timer);
  postOptimizationChecks<lineage::Data,lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::Solution>
            (&data,&search,__return_storage_ptr__);
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  ::~PartitionOptimizerBase
            (&search.
              super_PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&init);
  Data::~Data(&data);
  return __return_storage_ptr__;
}

Assistant:

Solution
applyInitializedHeuristic(
    ProblemGraph const& problemGraph, double costTermination = .0,
    double costBirth = .0, bool enforceBifurcationConstraint = false,
    std::string solutionName = "heuristic",
    size_t maxDistance = std::numeric_limits<size_t>::max())
{

    // create log file/replace existing log file with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    Data data(problemGraph);
    data.costBirth = costBirth;
    data.costTermination = costTermination;
    data.enforceBifurcationConstraint = enforceBifurcationConstraint;
    data.solutionName = solutionName;
    data.maxDistance = maxDistance;

    // define costs
    for (auto e : problemGraph.problem().edges)
        data.costs.push_back(e.weight);

    if (costTermination > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(),
                          costTermination);

    if (costBirth > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(), costBirth);

    Solution init;
    {
        data.timer.start();
        auto initializer = INITIALIZER(data);
        initializer.optimize();
        init = initializer.getSolution();
        data.timer.stop();
    }

    // create log replace log of initializer with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    data.timer.start();
    auto search = OPTIMIZER(data, init);

    search.optimize();
    const auto solution = search.getSolution();
    data.timer.stop();

    postOptimizationChecks(data, search, solution);

    return solution;
}